

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_inertial_and_magnetic_data.cpp
# Opt level: O2

void __thiscall
ximu::CalInertialAndMagneticData::CalInertialAndMagneticData
          (CalInertialAndMagneticData *this,Vector3f *gyroscope,Vector3f *accelerometer,
          Vector3f *magnetometer)

{
  (this->_gyroscope)._x = gyroscope->_x;
  (this->_gyroscope)._y = gyroscope->_y;
  (this->_gyroscope)._z = gyroscope->_z;
  (this->_accelerometer)._x = accelerometer->_x;
  (this->_accelerometer)._y = accelerometer->_y;
  (this->_accelerometer)._z = accelerometer->_z;
  (this->_magnetometer)._x = magnetometer->_x;
  (this->_magnetometer)._y = magnetometer->_y;
  (this->_magnetometer)._z = magnetometer->_z;
  return;
}

Assistant:

CalInertialAndMagneticData::CalInertialAndMagneticData(
     const Vector3f& gyroscope,
     const Vector3f& accelerometer,
     const Vector3f& magnetometer)
    :
    _gyroscope(gyroscope),
    _accelerometer(accelerometer),
    _magnetometer(magnetometer) {
}